

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-engine.cpp
# Opt level: O0

void __thiscall gepard::GepardEngine::stroke(GepardEngine *this)

{
  GepardEngine *this_local;
  
  if (this->_engineBackend != (GepardEngineBackend *)0x0) {
    gles2::GepardGLES2::strokePath(this->_engineBackend);
    return;
  }
  __assert_fail("_engineBackend",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/gepard-engine.cpp"
                ,0xfa,"void gepard::GepardEngine::stroke()");
}

Assistant:

void GepardEngine::stroke()
{
    GD_ASSERT(_engineBackend);
#ifdef GD_USE_GLES2
    _engineBackend->strokePath();
#else // !GD_USE_GLES2
    _engineBackend->stroke();
#endif // GD_USE_GLES2
}